

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * __thiscall
Catch::ExceptionTranslatorRegistry::translateActiveException_abi_cxx11_
          (ExceptionTranslatorRegistry *this)

{
  bool bVar1;
  string *in_RDI;
  TestFailureException *anon_var_0;
  exception *ex;
  string *msg;
  char *msg_1;
  exception_ptr *in_stack_ffffffffffffff30;
  string *this_00;
  allocator local_21;
  exception_ptr local_20;
  exception_ptr local_18 [3];
  
  this_00 = in_RDI;
  std::current_exception();
  clara::std::__exception_ptr::exception_ptr::exception_ptr(&local_20,(nullptr_t)0x0);
  bVar1 = clara::std::__exception_ptr::operator==(local_18,&local_20);
  clara::std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_ffffffffffffff30);
  clara::std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_ffffffffffffff30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)in_RDI,"Non C++ exception. Possibly a CLR exception.",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    tryTranslators_abi_cxx11_((ExceptionTranslatorRegistry *)this_00);
  }
  return this_00;
}

Assistant:

std::string ExceptionTranslatorRegistry::translateActiveException() const {
        try {
#ifdef __OBJC__
            // In Objective-C try objective-c exceptions first
            @try {
                return tryTranslators();
            }
            @catch (NSException *exception) {
                return Catch::Detail::stringify( [exception description] );
            }
#else
            // Compiling a mixed mode project with MSVC means that CLR
            // exceptions will be caught in (...) as well. However, these
            // do not fill-in std::current_exception and thus lead to crash
            // when attempting rethrow.
            // /EHa switch also causes structured exceptions to be caught
            // here, but they fill-in current_exception properly, so
            // at worst the output should be a little weird, instead of
            // causing a crash.
            if (std::current_exception() == nullptr) {
                return "Non C++ exception. Possibly a CLR exception.";
            }
            return tryTranslators();
#endif
        }
        catch( TestFailureException& ) {
            std::rethrow_exception(std::current_exception());
        }
        catch( std::exception& ex ) {
            return ex.what();
        }
        catch( std::string& msg ) {
            return msg;
        }
        catch( const char* msg ) {
            return msg;
        }
        catch(...) {
            return "Unknown exception";
        }
    }